

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<chaiscript::AST_Node_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
               (_func_AST_Node_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *bv;
  bad_boxed_cast *anon_var_0;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_40;
  undefined8 local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_AST_Node_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  bv = Function_Params::operator[](params,0);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            ((chaiscript *)&local_40,bv,(Type_Conversions_State *)i);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_40);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }